

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

void PaletteSortMinimizeDeltas(uint32_t *palette_sorted,int num_colors,uint32_t *palette)

{
  int iVar1;
  uint32_t *in_RDX;
  int in_ESI;
  void *in_RDI;
  uint32_t cur_score;
  uint32_t best_score;
  int best_ix;
  int k;
  int i;
  uint32_t predict;
  uint32_t in_stack_ffffffffffffffd0;
  uint col1;
  int local_28;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  undefined4 uVar3;
  int local_c;
  
  uVar3 = 0;
  memcpy(in_RDX,in_RDI,(long)in_ESI << 2);
  iVar1 = PaletteHasNonMonotonousDeltas
                    ((uint32_t *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc
                    );
  if (iVar1 != 0) {
    local_c = in_ESI;
    if ((0x11 < in_ESI) && (*in_RDX == 0)) {
      local_c = in_ESI + -1;
      SwapColor(in_RDX + local_c,in_RDX);
    }
    local_28 = 0;
    while (local_28 < local_c) {
      col1 = 0xffffffff;
      iVar2 = local_28;
      for (iVar1 = local_28; iVar1 < local_c; iVar1 = iVar1 + 1) {
        in_stack_ffffffffffffffd0 = PaletteColorDistance(col1,in_stack_ffffffffffffffd0);
        if (in_stack_ffffffffffffffd0 < col1) {
          col1 = in_stack_ffffffffffffffd0;
          local_28 = iVar1;
        }
      }
      SwapColor(in_RDX + local_28,in_RDX + iVar2);
      local_28 = iVar2 + 1;
    }
  }
  return;
}

Assistant:

static void PaletteSortMinimizeDeltas(const uint32_t* const palette_sorted,
                                      int num_colors, uint32_t* const palette) {
  uint32_t predict = 0x00000000;
  int i, k;
  memcpy(palette, palette_sorted, num_colors * sizeof(*palette));
  if (!PaletteHasNonMonotonousDeltas(palette_sorted, num_colors)) return;
  // Find greedily always the closest color of the predicted color to minimize
  // deltas in the palette. This reduces storage needs since the
  // palette is stored with delta encoding.
  if (num_colors > 17) {
    if (palette[0] == 0) {
      --num_colors;
      SwapColor(&palette[num_colors], &palette[0]);
    }
  }
  for (i = 0; i < num_colors; ++i) {
    int best_ix = i;
    uint32_t best_score = ~0U;
    for (k = i; k < num_colors; ++k) {
      const uint32_t cur_score = PaletteColorDistance(palette[k], predict);
      if (best_score > cur_score) {
        best_score = cur_score;
        best_ix = k;
      }
    }
    SwapColor(&palette[best_ix], &palette[i]);
    predict = palette[i];
  }
}